

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lest.hpp
# Opt level: O0

lest * __thiscall
lest::make_string<nonstd::expected_lite::unexpected_type<char>>
          (lest *this,unexpected_type<char> *item)

{
  lest local_38 [32];
  unexpected_type<char> *local_18;
  unexpected_type<char> *item_local;
  
  local_18 = item;
  item_local = (unexpected_type<char> *)this;
  make_enum_string<nonstd::expected_lite::unexpected_type<char>>(local_38,item);
  std::__cxx11::string::string((string *)this,(string *)local_38);
  std::__cxx11::string::~string((string *)local_38);
  return this;
}

Assistant:

auto make_string( T const & item ) -> ForNonStreamable<T, std::string>
{
    return make_enum_string( item );
}